

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O0

satoko_t * Gia_ManSatokoCreate(Gia_Man_t *p,satoko_opts_t *opts)

{
  Cnf_Dat_t *pCnf_00;
  undefined4 local_38;
  int status;
  satoko_t *pSat;
  Cnf_Dat_t *pCnf;
  satoko_opts_t *opts_local;
  Gia_Man_t *p_local;
  
  pCnf_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  p_local = (Gia_Man_t *)Gia_ManSatokoInit(pCnf_00,opts);
  if (p_local == (Gia_Man_t *)0x0) {
    local_38 = 1;
  }
  else {
    local_38 = satoko_simplify((solver_t *)p_local);
  }
  Cnf_DataFree(pCnf_00);
  if (local_38 != 1) {
    satoko_destroy((solver_t *)p_local);
    p_local = (Gia_Man_t *)0x0;
  }
  return (satoko_t *)p_local;
}

Assistant:

satoko_t * Gia_ManSatokoCreate( Gia_Man_t * p, satoko_opts_t * opts )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 1, 0, 0 );
    satoko_t * pSat = Gia_ManSatokoInit( pCnf, opts );
    int status = pSat ? satoko_simplify(pSat) : SATOKO_OK;
    Cnf_DataFree( pCnf );
    if ( status == SATOKO_OK )
        return pSat;
    satoko_destroy( pSat );
    return NULL;
}